

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::Bitstream::checkClassAccess(Type *type,ASTContext *context,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  SourceLocation diag;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar3;
  SourceLocation SVar4;
  ClassPropertySymbol *prop;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __end2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  *__range2;
  ClassType *ct;
  Scope *in_stack_00000218;
  Symbol *in_stack_00000220;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> *in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff80;
  Scope *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  SourceLocation SVar5;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  local_48;
  Type *arg;
  
  bVar1 = Type::isClass((Type *)0x5c4655);
  if (bVar1) {
    Type::getCanonicalType((Type *)in_stack_ffffffffffffff80);
    diag = (SourceLocation)Symbol::as<slang::ast::ClassType>((Symbol *)0x5c4678);
    local_48 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(in_stack_ffffffffffffff90);
    arg = (Type *)&local_48;
    sVar2 = std::ranges::
            subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
            ::begin((subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
                     *)arg);
    sVar3 = std::ranges::
            subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
            ::end((subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
                   *)arg);
    while (bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                             ((self_type *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      SVar4 = (SourceLocation)
              iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
              ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                           *)0x5c46e1);
      if ((*(int *)((long)SVar4 + 0x158) != 0) && (*(int *)((long)SVar4 + 0x150) == 0)) {
        SVar5 = SVar4;
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x5c471a);
        bVar1 = Lookup::isVisibleFrom(in_stack_00000220,in_stack_00000218);
        in_stack_ffffffffffffff80 = SVar4;
        if (!bVar1) {
          sourceRange_00.endLoc = (SourceLocation)sVar3.current;
          sourceRange_00.startLoc = SVar5;
          ASTContext::addDiag((ASTContext *)CONCAT44(0x3d0007,in_stack_ffffffffffffff98),
                              SUB84((ulong)sVar2.current >> 0x20,0),sourceRange_00);
          ast::operator<<((Diagnostic *)diag,arg);
          return false;
        }
      }
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                  *)in_stack_ffffffffffffff80);
    }
  }
  return true;
}

Assistant:

bool Bitstream::checkClassAccess(const Type& type, const ASTContext& context,
                                 SourceRange sourceRange) {
    if (!type.isClass())
        return true;

    auto& ct = type.getCanonicalType().as<ClassType>();
    for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
        if (prop.visibility != Visibility::Public && prop.lifetime == VariableLifetime::Automatic) {
            if (!Lookup::isVisibleFrom(prop, *context.scope)) {
                context.addDiag(diag::ClassPrivateMembersBitstream, sourceRange) << type;
                return false;
            }
        }
    }
    return true;
}